

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_feedback(REF_GRID ref_grid,char *filename)

{
  REF_INT RVar1;
  REF_GEOM pRVar2;
  REF_MPI pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  FILE *__s;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint local_9c;
  REF_INT edgeid;
  REF_GRID local_88;
  uint local_7c;
  char *local_78;
  REF_NODE local_70;
  REF_DBL curve;
  REF_DBL diag;
  REF_DBL short_edge;
  REF_DBL angle;
  REF_DBL location [3];
  
  pRVar2 = ref_grid->geom;
  pRVar3 = ref_grid->mpi;
  if (pRVar2->effective != 0) {
    if (pRVar3->id != 0) {
      return 0;
    }
    puts("ref_geom_feedback does not support Effective EGADS");
    return 0;
  }
  if ((ulong)ref_grid->partitioner != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xad5,
           "ref_geom_feedback","parallel implementation is incomplete",1,
           (ulong)ref_grid->partitioner);
    return 1;
  }
  local_70 = ref_grid->node;
  local_78 = filename;
  if ((pRVar3->id == 0) &&
     (puts("Triaging geometry for issues impacting efficiency and robustness"), pRVar3->id == 0)) {
    printf("scanning for discrete face corners with slivers or cusps of %.1f deg or less\n",
           0x4024000000000000);
    puts("slivers in flat regions constrain the mesh and are efficiency concerns");
    puts("cusps (very small angles) in curved regions may be fatal with loose tolerances");
    puts("  because the edge/face topology becomes ambiguous with adaptive refinement");
  }
  lVar15 = 0;
  local_9c = 0;
  for (lVar10 = 0; lVar10 < pRVar2->max; lVar10 = lVar10 + 1) {
    if (*(int *)((long)pRVar2->descr + lVar15) == 0) {
      RVar1 = *(REF_INT *)((long)pRVar2->descr + lVar15 + 0x14);
      uVar5 = ref_geom_node_min_angle(ref_grid,RVar1,&angle);
      if (uVar5 != 0) {
        uVar11 = (ulong)uVar5;
        pcVar12 = "node angle";
        uVar9 = 0xaee;
        goto LAB_0016ea4d;
      }
      if (angle <= 10.0) {
        lVar8 = (long)RVar1;
        pRVar4 = local_70->real;
        printf("%f %f %f # sliver deg=%.3f at geom node %d\n",pRVar4[lVar8 * 0xf],
               pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2],
               (ulong)*(uint *)((long)pRVar2->descr + lVar15 + 4));
        local_9c = local_9c + 1;
      }
    }
    lVar15 = lVar15 + 0x18;
  }
  iVar14 = pRVar3->id;
  if (iVar14 == 0) {
    printf("%d geometry nodes with slivers or cusps of %.1f deg or less\n",0x4024000000000000,
           (ulong)local_9c);
    iVar14 = pRVar3->id;
  }
  local_88 = ref_grid;
  if (pRVar2->model == (void *)0x0) {
    uVar11 = 0;
LAB_0016e84d:
    uVar5 = 0;
  }
  else {
    if (iVar14 == 0) {
      printf("scanning for geom nodes with shortest/longest edge ratios of %.3f or less\n",
             0x3f50624dd2f1a9fc);
      puts("short edges are efficiency concerns that rarely create failures.");
    }
    lVar10 = 0;
    uVar11 = 0;
    for (lVar15 = 0; lVar15 < pRVar2->max; lVar15 = lVar15 + 1) {
      if (*(int *)((long)pRVar2->descr + lVar10) == 0) {
        RVar1 = *(REF_INT *)((long)pRVar2->descr + lVar10 + 0x14);
        uVar5 = ref_geom_node_short_edge(local_88,RVar1,&short_edge,&diag,&edgeid);
        if (uVar5 != 0) {
          uVar11 = (ulong)uVar5;
          pcVar12 = "short edge";
          uVar9 = 0xb09;
          goto LAB_0016ea4d;
        }
        if (short_edge <= 0.001) {
          lVar8 = (long)RVar1;
          pRVar4 = local_70->real;
          printf("%f %f %f # short edge %.2e ratio %.2e id %d\n",pRVar4[lVar8 * 0xf],
                 pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2],diag,(ulong)(uint)edgeid);
          uVar11 = (ulong)((int)uVar11 + 1);
        }
      }
      lVar10 = lVar10 + 0x18;
    }
    iVar14 = pRVar3->id;
    if (iVar14 == 0) {
      printf("%d geometry nodes with shortest/longest edge ratios of %.3f or less\n",
             0x3f50624dd2f1a9fc,uVar11);
      iVar14 = pRVar3->id;
    }
    if (pRVar2->model == (void *)0x0) goto LAB_0016e84d;
    if (iVar14 == 0) {
      puts("scanning for surface curvature tighter than face-edge tolerance");
      puts("tight surface curvature is ignored where it reduces mesh");
      puts("  spacing below edge and face parameter curve tolerance");
      puts("these locations are likely to be accommodated unless");
      puts("  the error estimation resolves the high surface curvature");
    }
    uVar5 = 0;
    for (uVar13 = 1; (int)uVar13 <= pRVar2->nedge; uVar13 = uVar13 + 1) {
      uVar6 = ref_geom_face_curve_tol(local_88,uVar13,&curve,location);
      if (uVar6 != 0) {
        uVar11 = (ulong)uVar6;
        pcVar12 = "curved face";
        uVar9 = 0xb24;
        goto LAB_0016ea4d;
      }
      if (curve < 1.0) {
        printf("%f %f %f # curve/tol %.3e face id %d\n",location[0],location[1],location[2],
               (ulong)uVar13);
        uVar5 = uVar5 + 1;
      }
    }
    if (pRVar3->id != 0) {
      return 0;
    }
    printf("%d locations with filtered curvature\n",(ulong)uVar5);
    iVar14 = pRVar3->id;
  }
  pcVar12 = local_78;
  if ((iVar14 == 0) && (iVar14 = (int)uVar11, 0 < (int)uVar5 || (0 < iVar14 || 0 < (int)local_9c)))
  {
    __s = fopen(local_78,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",pcVar12);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xb34,
             "ref_geom_feedback","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine geometry triage\"\n",0x27,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
    if (0 < (int)local_9c) {
      lVar15 = 0;
      printf("exporting slivers locations to %s\n",local_78);
      fprintf(__s,"zone t=\"sliver\", i=%d, datapacking=%s\n",(ulong)local_9c,"point");
      local_7c = 0;
      for (lVar10 = 0; lVar10 < pRVar2->max; lVar10 = lVar10 + 1) {
        if (*(int *)((long)pRVar2->descr + lVar15) == 0) {
          RVar1 = *(REF_INT *)((long)pRVar2->descr + lVar15 + 0x14);
          uVar13 = ref_geom_node_min_angle(local_88,RVar1,&angle);
          if (uVar13 != 0) {
            uVar11 = (ulong)uVar13;
            pcVar12 = "node angle";
            uVar9 = 0xb3f;
            goto LAB_0016ea4d;
          }
          if (angle <= 10.0) {
            lVar8 = (long)RVar1;
            pRVar4 = local_70->real;
            fprintf(__s,"# sliver deg=%.3f at geom node %d\n %f %f %f\n",angle,pRVar4[lVar8 * 0xf],
                    pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2],
                    (ulong)*(uint *)((long)pRVar2->descr + lVar15 + 4));
            local_7c = local_7c + 1;
          }
        }
        lVar15 = lVar15 + 0x18;
      }
      if (local_9c != local_7c) {
        lVar10 = (long)(int)local_7c;
        uVar11 = (ulong)local_9c;
        pcVar12 = "tecplot sliver different recount";
        uVar9 = 0xb48;
        goto LAB_0016ed8d;
      }
    }
    if (0 < iVar14) {
      lVar10 = 0;
      printf("exporting short edge locations to %s\n",local_78);
      fprintf(__s,"zone t=\"short edge\", i=%d, datapacking=%s\n",uVar11,"point");
      local_9c = 0;
      for (lVar15 = 0; lVar15 < pRVar2->max; lVar15 = lVar15 + 1) {
        if (*(int *)((long)pRVar2->descr + lVar10) == 0) {
          RVar1 = *(REF_INT *)((long)pRVar2->descr + lVar10 + 0x14);
          uVar13 = ref_geom_node_short_edge(local_88,RVar1,&short_edge,&diag,&edgeid);
          if (uVar13 != 0) {
            uVar11 = (ulong)uVar13;
            pcVar12 = "short edge";
            uVar9 = 0xb54;
            goto LAB_0016ea4d;
          }
          if (short_edge <= 0.001) {
            lVar8 = (long)RVar1;
            pRVar4 = local_70->real;
            fprintf(__s,"# short edge diagonal %.3e ratio %.3e edge id %d\n%f %f %f\n",diag,
                    short_edge,pRVar4[lVar8 * 0xf],pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2],
                    (ulong)(uint)edgeid);
            local_9c = local_9c + 1;
          }
        }
        lVar10 = lVar10 + 0x18;
      }
      if (iVar14 != local_9c) {
        lVar10 = (long)(int)local_9c;
        pcVar12 = "tecplot short edge different recount";
        uVar9 = 0xb5e;
        goto LAB_0016ed8d;
      }
    }
    if (0 < (int)uVar5) {
      uVar6 = 0;
      printf("exporting filtered high curvature locations to %s\n",local_78);
      fprintf(__s,"zone t=\"filtered\", i=%d, datapacking=%s\n",(ulong)uVar5,"point");
      for (uVar13 = 1; (int)uVar13 <= pRVar2->nedge; uVar13 = uVar13 + 1) {
        uVar7 = ref_geom_face_curve_tol(local_88,uVar13,&curve,location);
        if (uVar7 != 0) {
          uVar11 = (ulong)uVar7;
          pcVar12 = "curved face";
          uVar9 = 0xb68;
LAB_0016ea4d:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar9,"ref_geom_feedback",uVar11,pcVar12);
          return (REF_STATUS)uVar11;
        }
        if (curve < 1.0) {
          fprintf(__s,"# curve/tol %.3e face id %d\n%f %f %f\n",curve,location[0],location[1],
                  location[2],(ulong)uVar13);
          uVar6 = uVar6 + 1;
        }
      }
      if (uVar5 != uVar6) {
        lVar10 = (long)(int)uVar6;
        uVar11 = (ulong)uVar5;
        pcVar12 = "tecplot filtered curvature different recount";
        uVar9 = 0xb6f;
LAB_0016ed8d:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar9,"ref_geom_feedback",pcVar12,uVar11,lVar10);
        return 1;
      }
    }
    fclose(__s);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_feedback(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT geom, node, edgeid, faceid;
  REF_DBL angle_tol = 10.0;
  REF_DBL angle;
  REF_DBL short_edge_tol = 1e-3;
  REF_DBL short_edge, diag;
  REF_DBL curve;
  REF_DBL location[3];
  REF_INT nsliver, nshort, nfilter;

  if (ref_geom_effective(ref_geom)) {
    /* EFFECTIVE */
    if (ref_mpi_once(ref_grid_mpi(ref_grid)))
      printf("ref_geom_feedback does not support Effective EGADS\n");
    return REF_SUCCESS;
  }

  REIS(REF_MIGRATE_SINGLE, ref_grid_partitioner(ref_grid),
       "parallel implementation is incomplete");

  if (ref_mpi_once(ref_mpi))
    printf(
        "Triaging geometry for issues impacting efficiency and robustness\n");

  if (ref_mpi_once(ref_mpi)) {
    printf(
        "scanning for discrete face corners with slivers or cusps of %.1f deg "
        "or "
        "less\n",
        angle_tol);
    printf(
        "slivers in flat regions constrain the mesh and are efficiency "
        "concerns\n");
    printf(
        "cusps (very small angles) in curved regions may be fatal with loose "
        "tolerances\n");
    printf(
        "  because the edge/face topology becomes ambiguous with adaptive "
        "refinement\n");
  }
  nsliver = 0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    RSS(ref_geom_node_min_angle(ref_grid, node, &angle), "node angle");
    if (angle <= angle_tol) {
      printf("%f %f %f # sliver deg=%.3f at geom node %d\n",
             ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
             ref_node_xyz(ref_node, 2, node), angle,
             ref_geom_id(ref_geom, geom));
      nsliver++;
    }
  }
  if (ref_mpi_once(ref_mpi))
    printf("%d geometry nodes with slivers or cusps of %.1f deg or less\n",
           nsliver, angle_tol);

  nshort = 0;
  if (ref_geom_model_loaded(ref_geom)) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "scanning for geom nodes with shortest/longest edge ratios of %.3f "
          "or "
          "less\n",
          short_edge_tol);
      printf(
          "short edges are efficiency concerns that rarely create failures.\n");
    }
    each_ref_geom_node(ref_geom, geom) {
      node = ref_geom_node(ref_geom, geom);
      RSS(ref_geom_node_short_edge(ref_grid, node, &short_edge, &diag, &edgeid),
          "short edge");
      if (short_edge <= short_edge_tol) {
        printf("%f %f %f # short edge %.2e ratio %.2e id %d\n",
               ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
               ref_node_xyz(ref_node, 2, node), diag, short_edge, edgeid);
        nshort++;
      }
    }
    if (ref_mpi_once(ref_mpi))
      printf(
          "%d geometry nodes with shortest/longest edge ratios of %.3f or "
          "less\n",
          nshort, short_edge_tol);
  }

  nfilter = 0;
  if (ref_geom_model_loaded(ref_geom)) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "scanning for surface curvature tighter than face-edge tolerance\n");
      printf("tight surface curvature is ignored where it reduces mesh\n");
      printf("  spacing below edge and face parameter curve tolerance\n");
      printf("these locations are likely to be accommodated unless\n");
      printf("  the error estimation resolves the high surface curvature\n");
    }
    for (faceid = 1; faceid <= ref_geom->nedge; faceid++) {
      RSS(ref_geom_face_curve_tol(ref_grid, faceid, &curve, location),
          "curved face");
      if (curve < 1.0) {
        printf("%f %f %f # curve/tol %.3e face id %d\n", location[0],
               location[1], location[2], curve, faceid);
        nfilter++;
      }
    }
    if (ref_mpi_once(ref_mpi))
      printf("%d locations with filtered curvature\n", nfilter);
  }

  if (ref_mpi_once(ref_mpi) && (nsliver > 0 || nshort > 0 || nfilter > 0)) {
    FILE *file;
    REF_INT n;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine geometry triage\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

    if (nsliver > 0) {
      printf("exporting slivers locations to %s\n", filename);
      fprintf(file, "zone t=\"sliver\", i=%d, datapacking=%s\n", nsliver,
              "point");
      n = 0;
      each_ref_geom_node(ref_geom, geom) {
        node = ref_geom_node(ref_geom, geom);
        RSS(ref_geom_node_min_angle(ref_grid, node, &angle), "node angle");
        if (angle <= angle_tol) {
          fprintf(file, "# sliver deg=%.3f at geom node %d\n %f %f %f\n", angle,
                  ref_geom_id(ref_geom, geom), ref_node_xyz(ref_node, 0, node),
                  ref_node_xyz(ref_node, 1, node),
                  ref_node_xyz(ref_node, 2, node));
          n++;
        }
      }
      REIS(nsliver, n, "tecplot sliver different recount");
    }

    if (nshort > 0) {
      printf("exporting short edge locations to %s\n", filename);
      fprintf(file, "zone t=\"short edge\", i=%d, datapacking=%s\n", nshort,
              "point");
      n = 0;
      each_ref_geom_node(ref_geom, geom) {
        node = ref_geom_node(ref_geom, geom);
        RSS(ref_geom_node_short_edge(ref_grid, node, &short_edge, &diag,
                                     &edgeid),
            "short edge");
        if (short_edge <= short_edge_tol) {
          fprintf(
              file,
              "# short edge diagonal %.3e ratio %.3e edge id %d\n%f %f %f\n",
              diag, short_edge, edgeid, ref_node_xyz(ref_node, 0, node),
              ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));
          n++;
        }
      }
      REIS(nshort, n, "tecplot short edge different recount");
    }

    if (nfilter > 0) {
      printf("exporting filtered high curvature locations to %s\n", filename);
      fprintf(file, "zone t=\"filtered\", i=%d, datapacking=%s\n", nfilter,
              "point");
      n = 0;
      for (faceid = 1; faceid <= ref_geom->nedge; faceid++) {
        RSS(ref_geom_face_curve_tol(ref_grid, faceid, &curve, location),
            "curved face");
        if (curve < 1.0) {
          fprintf(file, "# curve/tol %.3e face id %d\n%f %f %f\n", curve,
                  faceid, location[0], location[1], location[2]);
          n++;
        }
      }
      REIS(nfilter, n, "tecplot filtered curvature different recount");
    }

    fclose(file);
  }
  return REF_SUCCESS;
}